

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Optimisations.h
# Opt level: O2

int __thiscall
soul::Optimisations::Inliner::clone
          (Inliner *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Module *this_00;
  Expression *pEVar1;
  ReadStream *pRVar2;
  
  this_00 = this->module;
  pEVar1 = pool_ptr<soul::heart::Expression>::operator*
                     ((pool_ptr<soul::heart::Expression> *)(__fn + 0x20));
  pEVar1 = cloneExpression(this,pEVar1);
  pRVar2 = Module::
           allocate<soul::heart::ReadStream,soul::CodeLocation_const&,soul::heart::Expression&,soul::pool_ref<soul::heart::InputDeclaration>const&>
                     (this_00,(CodeLocation *)(__fn + 8),pEVar1,
                      (pool_ref<soul::heart::InputDeclaration> *)(__fn + 0x28));
  return (int)pRVar2;
}

Assistant:

heart::ReadStream& clone (const heart::ReadStream& old)
        {
            return module.allocate<heart::ReadStream> (old.location, cloneExpression (*old.target), old.source);
        }